

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QPodArrayOps<Qt::DayOfWeek>::reallocate
          (QPodArrayOps<Qt::DayOfWeek> *this,qsizetype alloc,AllocationOption option)

{
  long lVar1;
  AllocationOption in_EDX;
  qsizetype in_RSI;
  DayOfWeek *in_RDI;
  long in_FS_OFFSET;
  pair<QTypedArrayData<Qt::DayOfWeek>_*,_Qt::DayOfWeek_*> pVar2;
  pair<QTypedArrayData<Qt::DayOfWeek>_*,_Qt::DayOfWeek_*> pair;
  DayOfWeek *local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pVar2 = QTypedArrayData<Qt::DayOfWeek>::reallocateUnaligned
                    ((QTypedArrayData<Qt::DayOfWeek> *)&DAT_aaaaaaaaaaaaaaaa,in_RDI,in_RSI,in_EDX);
  local_10 = pVar2.second;
  if (local_10 == (DayOfWeek *)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      qBadAlloc();
    }
  }
  else {
    *(QTypedArrayData<Qt::DayOfWeek> **)in_RDI = pVar2.first;
    *(DayOfWeek **)(in_RDI + 2) = local_10;
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

void reallocate(qsizetype alloc, QArrayData::AllocationOption option)
    {
        auto pair = Data::reallocateUnaligned(this->d, this->ptr, alloc, option);
        Q_CHECK_PTR(pair.second);
        Q_ASSERT(pair.first != nullptr);
        this->d = pair.first;
        this->ptr = pair.second;
    }